

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

_detail * __thiscall
slack::_detail::join<slack::_detail::Element>
          (_detail *this,
          vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *vec,string *sep
          )

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *os;
  ulong local_1c8;
  size_t i;
  allocator local_1a9;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  string *local_20;
  string *sep_local;
  vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *vec_local;
  
  local_20 = sep;
  sep_local = (string *)vec;
  vec_local = (vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  sVar1 = std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::size
                    ((vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *)
                     sep_local);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_1a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  }
  else {
    pvVar2 = std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::
             operator[]((vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *
                        )sep_local,0);
    operator<<(local_198,pvVar2);
    local_1c8 = 1;
    while( true ) {
      sVar1 = std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::size
                        ((vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                          *)sep_local);
      if (sVar1 <= local_1c8) break;
      os = std::operator<<(local_198,(string *)local_20);
      pvVar2 = std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::
               operator[]((vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
                           *)sep_local,local_1c8);
      operator<<(os,pvVar2);
      local_1c8 = local_1c8 + 1;
    }
    std::__cxx11::stringstream::str();
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

inline
std::string join(const std::vector<T>& vec, const std::string& sep) {
    std::stringstream ss;
    if (vec.size() == 0) { return ""; };
    ss << vec[0];
    for (size_t i = 1; i < vec.size(); i ++) { ss << sep << vec[i]; }
    return ss.str();
}